

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_instance.cpp
# Opt level: O0

XrResult ActiveLoaderInstance::Set
                   (unique_ptr<LoaderInstance,_std::default_delete<LoaderInstance>_>
                    *loader_instance,char *log_function_name)

{
  char *pcVar1;
  bool bVar2;
  unique_ptr<LoaderInstance,_std::default_delete<LoaderInstance>_> *puVar3;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_98;
  allocator local_79;
  string local_78;
  allocator local_41;
  string local_40;
  char *local_20;
  char *log_function_name_local;
  unique_ptr<LoaderInstance,_std::default_delete<LoaderInstance>_> *loader_instance_local;
  
  local_20 = log_function_name;
  log_function_name_local = (char *)loader_instance;
  puVar3 = anon_unknown.dwarf_3a913::GetSetCurrentLoaderInstance();
  bVar2 = std::operator!=(puVar3,(nullptr_t)0x0);
  pcVar1 = local_20;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,pcVar1,&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_78,"Active XrInstance handle already exists",&local_79);
    local_98.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::vector(&local_98);
    LoaderLogger::LogErrorMessage(&local_40,&local_78,&local_98);
    std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_98);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    loader_instance_local._4_4_ = XR_ERROR_LIMIT_REACHED;
  }
  else {
    puVar3 = anon_unknown.dwarf_3a913::GetSetCurrentLoaderInstance();
    std::unique_ptr<LoaderInstance,_std::default_delete<LoaderInstance>_>::operator=
              (puVar3,loader_instance);
    loader_instance_local._4_4_ = XR_SUCCESS;
  }
  return loader_instance_local._4_4_;
}

Assistant:

XrResult Set(std::unique_ptr<LoaderInstance> loader_instance, const char* log_function_name) {
    if (GetSetCurrentLoaderInstance() != nullptr) {
        LoaderLogger::LogErrorMessage(log_function_name, "Active XrInstance handle already exists");
        return XR_ERROR_LIMIT_REACHED;
    }

    GetSetCurrentLoaderInstance() = std::move(loader_instance);
    return XR_SUCCESS;
}